

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_debug.h
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
phmap::priv::GetHashtableDebugNumProbesHistogram<phmap::priv::(anonymous_namespace)::IntTable>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          IntTable *container)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ulong uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  uint uVar5;
  undefined1 uVar6;
  ulong uVar7;
  long lVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  pointer puVar10;
  size_t sVar11;
  long lVar12;
  uint uVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar14;
  ulong *puVar15;
  __m128i match;
  undefined1 auVar16 [16];
  char cVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  char cVar21;
  char cVar22;
  char cVar23;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar9 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           (container->
           super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
           ).ctrl_;
  puVar15 = (ulong *)(container->
                     super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                     ).slots_;
  cVar19 = *(char *)&(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
  pvVar14 = pvVar9;
  while (cVar19 < -1) {
    auVar16[0] = -(*(char *)&(pvVar14->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start < -1);
    auVar16[1] = -(*(char *)((long)&(pvVar14->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1) < -1);
    auVar16[2] = -(*(char *)((long)&(pvVar14->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 2) < -1);
    auVar16[3] = -(*(char *)((long)&(pvVar14->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 3) < -1);
    auVar16[4] = -(*(char *)((long)&(pvVar14->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 4) < -1);
    auVar16[5] = -(*(char *)((long)&(pvVar14->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 5) < -1);
    auVar16[6] = -(*(char *)((long)&(pvVar14->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 6) < -1);
    auVar16[7] = -(*(char *)((long)&(pvVar14->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 7) < -1);
    auVar16[8] = -(*(char *)&(pvVar14->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish < -1);
    auVar16[9] = -(*(char *)((long)&(pvVar14->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + 1) < -1);
    auVar16[10] = -(*(char *)((long)&(pvVar14->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + 2) < -1);
    auVar16[0xb] = -(*(char *)((long)&(pvVar14->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + 3) < -1);
    auVar16[0xc] = -(*(char *)((long)&(pvVar14->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + 4) < -1);
    auVar16[0xd] = -(*(char *)((long)&(pvVar14->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + 5) < -1);
    auVar16[0xe] = -(*(char *)((long)&(pvVar14->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + 6) < -1);
    auVar16[0xf] = -(*(char *)((long)&(pvVar14->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + 7) < -1);
    uVar5 = (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar16[0xf] >> 7) << 0xf) + 1;
    uVar13 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
      }
    }
    uVar3 = (ulong)uVar13;
    puVar15 = puVar15 + uVar3;
    cVar19 = *(char *)((long)&(pvVar14->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + uVar3);
    pvVar14 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)&(pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start + uVar3);
  }
  sVar11 = (container->
           super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
           ).capacity_;
  pvVar4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ((long)&(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + sVar11);
  if (pvVar14 != pvVar4) {
    puVar10 = (pointer)0x0;
    do {
      if (pvVar9 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        lVar8 = 0;
      }
      else {
        if ((sVar11 + 1 & sVar11) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *puVar15;
        uVar7 = SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0);
        uVar3 = uVar7 >> 7 ^ (ulong)pvVar9 >> 0xc;
        uVar6 = (undefined1)uVar7;
        auVar16 = ZEXT216(CONCAT11(uVar6,uVar6) & 0x7f7f);
        auVar16 = pshuflw(auVar16,auVar16,0);
        lVar12 = 0;
        lVar8 = 0;
        while( true ) {
          uVar3 = uVar3 & sVar11;
          auVar1 = *(undefined1 (*) [16])
                    ((long)&(pvVar9->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + uVar3);
          cVar19 = auVar16[0];
          auVar20[0] = -(cVar19 == auVar1[0]);
          cVar21 = auVar16[1];
          auVar20[1] = -(cVar21 == auVar1[1]);
          cVar22 = auVar16[2];
          auVar20[2] = -(cVar22 == auVar1[2]);
          cVar23 = auVar16[3];
          auVar20[3] = -(cVar23 == auVar1[3]);
          auVar20[4] = -(cVar19 == auVar1[4]);
          auVar20[5] = -(cVar21 == auVar1[5]);
          auVar20[6] = -(cVar22 == auVar1[6]);
          auVar20[7] = -(cVar23 == auVar1[7]);
          auVar20[8] = -(cVar19 == auVar1[8]);
          auVar20[9] = -(cVar21 == auVar1[9]);
          auVar20[10] = -(cVar22 == auVar1[10]);
          auVar20[0xb] = -(cVar23 == auVar1[0xb]);
          auVar20[0xc] = -(cVar19 == auVar1[0xc]);
          auVar20[0xd] = -(cVar21 == auVar1[0xd]);
          auVar20[0xe] = -(cVar22 == auVar1[0xe]);
          cVar19 = auVar1[0xf];
          auVar20[0xf] = -(cVar23 == cVar19);
          uVar2 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar20[0xf] >> 7) << 0xf;
          if (uVar2 != 0) {
            uVar13 = (uint)uVar2;
            do {
              uVar5 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                }
              }
              if ((container->
                  super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                  ).slots_[uVar5 + uVar3 & sVar11] == *puVar15) goto LAB_0012cfaa;
              lVar8 = lVar8 + 1;
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
          }
          auVar17[0] = -(auVar1[0] == -0x80);
          auVar17[1] = -(auVar1[1] == -0x80);
          auVar17[2] = -(auVar1[2] == -0x80);
          auVar17[3] = -(auVar1[3] == -0x80);
          auVar17[4] = -(auVar1[4] == -0x80);
          auVar17[5] = -(auVar1[5] == -0x80);
          auVar17[6] = -(auVar1[6] == -0x80);
          auVar17[7] = -(auVar1[7] == -0x80);
          auVar17[8] = -(auVar1[8] == -0x80);
          auVar17[9] = -(auVar1[9] == -0x80);
          auVar17[10] = -(auVar1[10] == -0x80);
          auVar17[0xb] = -(auVar1[0xb] == -0x80);
          auVar17[0xc] = -(auVar1[0xc] == -0x80);
          auVar17[0xd] = -(auVar1[0xd] == -0x80);
          auVar17[0xe] = -(auVar1[0xe] == -0x80);
          auVar17[0xf] = -(cVar19 == -0x80);
          if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar19 == -0x80
             ) break;
          uVar3 = uVar3 + lVar12 + 0x10;
          lVar12 = lVar12 + 0x10;
          lVar8 = lVar8 + 1;
        }
      }
LAB_0012cfaa:
      uVar3 = (long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar10 >> 3;
      if (uVar3 <= lVar8 + 1U) {
        uVar3 = lVar8 + 1U;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (__return_storage_ptr__,uVar3);
      puVar10 = (__return_storage_ptr__->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar10[lVar8] = puVar10[lVar8] + 1;
      puVar15 = puVar15 + 1;
      cVar19 = *(char *)((long)&(pvVar14->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start + 1);
      pvVar14 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                ((long)&(pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1);
      while (cVar19 < -1) {
        auVar18[0] = -(*(char *)&(pvVar14->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start < -1);
        auVar18[1] = -(*(char *)((long)&(pvVar14->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 1) < -1);
        auVar18[2] = -(*(char *)((long)&(pvVar14->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 2) < -1);
        auVar18[3] = -(*(char *)((long)&(pvVar14->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 3) < -1);
        auVar18[4] = -(*(char *)((long)&(pvVar14->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 4) < -1);
        auVar18[5] = -(*(char *)((long)&(pvVar14->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 5) < -1);
        auVar18[6] = -(*(char *)((long)&(pvVar14->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 6) < -1);
        auVar18[7] = -(*(char *)((long)&(pvVar14->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 7) < -1);
        auVar18[8] = -(*(char *)&(pvVar14->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish < -1);
        auVar18[9] = -(*(char *)((long)&(pvVar14->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + 1) < -1);
        auVar18[10] = -(*(char *)((long)&(pvVar14->
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Vector_impl_data._M_finish + 2) < -1);
        auVar18[0xb] = -(*(char *)((long)&(pvVar14->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish + 3) < -1);
        auVar18[0xc] = -(*(char *)((long)&(pvVar14->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish + 4) < -1);
        auVar18[0xd] = -(*(char *)((long)&(pvVar14->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish + 5) < -1);
        auVar18[0xe] = -(*(char *)((long)&(pvVar14->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish + 6) < -1);
        auVar18[0xf] = -(*(char *)((long)&(pvVar14->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish + 7) < -1);
        uVar5 = (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar18[0xf] >> 7) << 0xf) + 1;
        uVar13 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
        uVar3 = (ulong)uVar13;
        puVar15 = puVar15 + uVar3;
        cVar19 = *(char *)((long)&(pvVar14->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + uVar3);
        pvVar14 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)&(pvVar14->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + uVar3);
      }
      pvVar9 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (container->
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               ).ctrl_;
      sVar11 = (container->
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               ).capacity_;
      pvVar4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start + sVar11);
    } while (pvVar14 != pvVar4);
  }
  return pvVar4;
}

Assistant:

std::vector<size_t> GetHashtableDebugNumProbesHistogram(const C& container) {
  std::vector<size_t> v;
  for (auto it = container.begin(); it != container.end(); ++it) {
    size_t num_probes = GetHashtableDebugNumProbes(
        container,
        phmap::priv::hashtable_debug_internal::GetKey<C>(*it, 0));
    v.resize((std::max)(v.size(), num_probes + 1));
    v[num_probes]++;
  }
  return v;
}